

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O1

void av1_row_mt_sync_mem_dealloc(AV1EncRowMultiThreadSync *row_mt_sync)

{
  long lVar1;
  long lVar2;
  
  if (row_mt_sync != (AV1EncRowMultiThreadSync *)0x0) {
    if (row_mt_sync->mutex_ != (pthread_mutex_t *)0x0) {
      if (0 < row_mt_sync->rows) {
        lVar1 = 0;
        lVar2 = 0;
        do {
          pthread_mutex_destroy((pthread_mutex_t *)((long)row_mt_sync->mutex_ + lVar1));
          lVar2 = lVar2 + 1;
          lVar1 = lVar1 + 0x28;
        } while (lVar2 < row_mt_sync->rows);
      }
      aom_free(row_mt_sync->mutex_);
    }
    if (row_mt_sync->cond_ != (pthread_cond_t *)0x0) {
      if (0 < row_mt_sync->rows) {
        lVar1 = 0;
        lVar2 = 0;
        do {
          pthread_cond_destroy((pthread_cond_t *)((long)row_mt_sync->cond_ + lVar1));
          lVar2 = lVar2 + 1;
          lVar1 = lVar1 + 0x30;
        } while (lVar2 < row_mt_sync->rows);
      }
      aom_free(row_mt_sync->cond_);
    }
    aom_free(row_mt_sync->num_finished_cols);
    row_mt_sync->rows = 0;
    row_mt_sync->next_mi_row = 0;
    *(undefined8 *)&row_mt_sync->num_threads_working = 0;
    row_mt_sync->num_finished_cols = (int *)0x0;
    row_mt_sync->sync_range = 0;
    row_mt_sync->intrabc_extra_top_right_sb_delay = 0;
    row_mt_sync->mutex_ = (pthread_mutex_t *)0x0;
    row_mt_sync->cond_ = (pthread_cond_t *)0x0;
  }
  return;
}

Assistant:

void av1_row_mt_sync_mem_dealloc(AV1EncRowMultiThreadSync *row_mt_sync) {
  if (row_mt_sync != NULL) {
#if CONFIG_MULTITHREAD
    int i;

    if (row_mt_sync->mutex_ != NULL) {
      for (i = 0; i < row_mt_sync->rows; ++i) {
        pthread_mutex_destroy(&row_mt_sync->mutex_[i]);
      }
      aom_free(row_mt_sync->mutex_);
    }
    if (row_mt_sync->cond_ != NULL) {
      for (i = 0; i < row_mt_sync->rows; ++i) {
        pthread_cond_destroy(&row_mt_sync->cond_[i]);
      }
      aom_free(row_mt_sync->cond_);
    }
#endif  // CONFIG_MULTITHREAD
    aom_free(row_mt_sync->num_finished_cols);

    // clear the structure as the source of this call may be dynamic change
    // in tiles in which case this call will be followed by an _alloc()
    // which may fail.
    av1_zero(*row_mt_sync);
  }
}